

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1651::~TestCase1651(TestCase1651 *this)

{
  TestCase1651 *this_local;
  
  kj::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

TEST(Orphans, ConcatenateStructLists) {
  // In this test, we not only concatenate two struct lists, but we concatenate in a list that
  // contains a newer-than-expected version of the struct with extra fields, in order to verify
  // that the new fields aren't lost.

  MallocMessageBuilder message;
  auto orphanage = message.getOrphanage();

  auto orphan1 = orphanage.newOrphan<List<test::TestOldVersion>>(2);
  auto list1 = orphan1.get();
  list1[0].setOld1(12);
  list1[0].setOld2("foo");
  list1[1].setOld1(34);
  list1[1].setOld2("bar");

  auto orphan2 = orphanage.newOrphan<test::TestAnyPointer>();
  auto list2 = orphan2.get().getAnyPointerField().initAs<List<test::TestNewVersion>>(2);
  list2[0].setOld1(56);
  list2[0].setOld2("baz");
  list2[0].setNew1(123);
  list2[0].setNew2("corge");
  list2[1].setOld1(78);
  list2[1].setOld2("qux");
  list2[1].setNew1(456);
  list2[1].setNew2("grault");

  List<test::TestOldVersion>::Reader lists[] = {
    orphan1.getReader(),
    orphan2.getReader().getAnyPointerField().getAs<List<test::TestOldVersion>>()
  };
  kj::ArrayPtr<List<test::TestOldVersion>::Reader> array = lists;

  auto orphan3 = orphanage.newOrphan<test::TestAnyPointer>();
  orphan3.get().getAnyPointerField().adopt(message.getOrphanage().newOrphanConcat(array));

  auto cat = orphan3.getReader().getAnyPointerField().getAs<List<test::TestNewVersion>>();
  ASSERT_EQ(4, cat.size());

  EXPECT_EQ(12, cat[0].getOld1());
  EXPECT_EQ("foo", cat[0].getOld2());
  EXPECT_EQ(987, cat[0].getNew1());
  EXPECT_FALSE(cat[0].hasNew2());

  EXPECT_EQ(34, cat[1].getOld1());
  EXPECT_EQ("bar", cat[1].getOld2());
  EXPECT_EQ(987, cat[1].getNew1());
  EXPECT_FALSE(cat[1].hasNew2());

  EXPECT_EQ(56, cat[2].getOld1());
  EXPECT_EQ("baz", cat[2].getOld2());
  EXPECT_EQ(123, cat[2].getNew1());
  EXPECT_EQ("corge", cat[2].getNew2());

  EXPECT_EQ(78, cat[3].getOld1());
  EXPECT_EQ("qux", cat[3].getOld2());
  EXPECT_EQ(456, cat[3].getNew1());
  EXPECT_EQ("grault", cat[3].getNew2());
}